

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_integer_encodeBigInt32(sysbvm_context_t *context,int32_t value)

{
  sysbvm_tuple_t local_38;
  sysbvm_integer_t *result;
  int32_t value_local;
  sysbvm_context_t *context_local;
  
  if (((long)value < -0x800000000000000) || (0x7ffffffffffffff < (long)value)) {
    if (value < 0) {
      local_38 = (context->roots).largeNegativeIntegerType;
    }
    else {
      local_38 = (context->roots).largePositiveIntegerType;
    }
    context_local = (sysbvm_context_t *)sysbvm_context_allocateByteTuple(context,local_38,4);
    if (value < 0) {
      *(int32_t *)&(context_local->heap).shouldAttemptToCollect = -value;
    }
    else {
      *(int32_t *)&(context_local->heap).shouldAttemptToCollect = value;
    }
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeSmall((long)value);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_integer_encodeBigInt32(sysbvm_context_t *context, int32_t value)
{
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wtype-limits"
#endif
    if(SYSBVM_IMMEDIATE_INT_MIN <= value && value <= SYSBVM_IMMEDIATE_INT_MAX)
        return sysbvm_tuple_integer_encodeSmall(value);

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif

    sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, value >= 0 ? context->roots.largePositiveIntegerType : context->roots.largeNegativeIntegerType, 4);
    if(value >= 0)
        result->words[0] = (uint32_t)value;
    else
        result->words[0] = (uint32_t)(-value);
    return (sysbvm_tuple_t)result;
}